

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1147904::Target::DumpSource
          (Value *__return_storage_ptr__,Target *this,SourceAndKind *sk,ArrayIndex si)

{
  bool bVar1;
  ArrayIndex AVar2;
  string *psVar3;
  Value *pVVar4;
  Value local_120;
  Value local_f8;
  cmSourceGroup *local_d0;
  cmSourceGroup *sg;
  string local_a0;
  Value local_80;
  undefined1 local_48 [8];
  string path;
  ArrayIndex si_local;
  SourceAndKind *sk_local;
  Target *this_local;
  Value *source;
  
  path.field_2._M_local_buf[0xb] = '\0';
  path.field_2._12_4_ = si;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  psVar3 = cmSourceFile::ResolveFullPath((sk->Source).Value,(string *)0x0,(string *)0x0);
  std::__cxx11::string::string((string *)local_48,(string *)psVar3);
  RelativeIfUnder(&local_a0,&this->TopSource,(string *)local_48);
  Json::Value::Value(&local_80,&local_a0);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar4,&local_80);
  Json::Value::~Value(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = cmSourceFile::GetIsGenerated((sk->Source).Value,GlobalAndLocal);
  if (bVar1) {
    Json::Value::Value((Value *)&sg,true);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"isGenerated");
    Json::Value::operator=(pVVar4,(Value *)&sg);
    Json::Value::~Value((Value *)&sg);
  }
  AddBacktrace(this,__return_storage_ptr__,&(sk->Source).Backtrace);
  local_d0 = cmMakefile::FindSourceGroup
                       (this->GT->Makefile,(string *)local_48,&this->SourceGroupsLocal);
  if (local_d0 != (cmSourceGroup *)0x0) {
    AVar2 = AddSourceGroup(this,local_d0,path.field_2._12_4_);
    Json::Value::Value(&local_f8,AVar2);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"sourceGroupIndex");
    Json::Value::operator=(pVVar4,&local_f8);
    Json::Value::~Value(&local_f8);
  }
  if ((SourceKindModuleDefinition < sk->Kind) && (sk->Kind == SourceKindObjectSource)) {
    AVar2 = AddSourceCompileGroup(this,(sk->Source).Value,path.field_2._12_4_);
    Json::Value::Value(&local_120,AVar2);
    pVVar4 = Json::Value::operator[](__return_storage_ptr__,"compileGroupIndex");
    Json::Value::operator=(pVVar4,&local_120);
    Json::Value::~Value(&local_120);
  }
  path.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((path.field_2._M_local_buf[0xb] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpSource(cmGeneratorTarget::SourceAndKind const& sk,
                               Json::ArrayIndex si)
{
  Json::Value source = Json::objectValue;

  std::string const path = sk.Source.Value->ResolveFullPath();
  source["path"] = RelativeIfUnder(this->TopSource, path);
  if (sk.Source.Value->GetIsGenerated()) {
    source["isGenerated"] = true;
  }
  this->AddBacktrace(source, sk.Source.Backtrace);

  if (cmSourceGroup* sg =
        this->GT->Makefile->FindSourceGroup(path, this->SourceGroupsLocal)) {
    source["sourceGroupIndex"] = this->AddSourceGroup(sg, si);
  }

  switch (sk.Kind) {
    case cmGeneratorTarget::SourceKindObjectSource: {
      source["compileGroupIndex"] =
        this->AddSourceCompileGroup(sk.Source.Value, si);
    } break;
    case cmGeneratorTarget::SourceKindAppManifest:
    case cmGeneratorTarget::SourceKindCertificate:
    case cmGeneratorTarget::SourceKindCustomCommand:
    case cmGeneratorTarget::SourceKindExternalObject:
    case cmGeneratorTarget::SourceKindExtra:
    case cmGeneratorTarget::SourceKindHeader:
    case cmGeneratorTarget::SourceKindIDL:
    case cmGeneratorTarget::SourceKindManifest:
    case cmGeneratorTarget::SourceKindModuleDefinition:
    case cmGeneratorTarget::SourceKindResx:
    case cmGeneratorTarget::SourceKindXaml:
    case cmGeneratorTarget::SourceKindUnityBatched:
      break;
  }

  return source;
}